

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QLayoutItem_*>::replace(QList<QLayoutItem_*> *this,qsizetype i,parameter_type t)

{
  QLayoutItem **ppQVar1;
  QArrayDataPointer<QLayoutItem_*> *in_RDX;
  long in_RSI;
  QArrayDataPointer<QLayoutItem_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer oldData;
  QArrayDataPointer<QLayoutItem_*> *in_stack_ffffffffffffffb0;
  QArrayDataPointer<QLayoutItem_*> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QLayoutItem **)&DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<QLayoutItem_*>::QArrayDataPointer(&local_28);
  QArrayDataPointer<QLayoutItem_*>::detach(in_stack_ffffffffffffffb0,in_RDI);
  ppQVar1 = QArrayDataPointer<QLayoutItem_*>::data(in_RDI);
  ppQVar1[in_RSI] = (QLayoutItem *)in_RDX;
  QArrayDataPointer<QLayoutItem_*>::~QArrayDataPointer(in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replace(qsizetype i, parameter_type t)
    {
        Q_ASSERT_X(i >= 0 && i < d->size, "QList<T>::replace", "index out of range");
        DataPointer oldData;
        d.detach(&oldData);
        d.data()[i] = t;
    }